

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<char_*,_char>_>::write_decimal<int>
          (basic_writer<fmt::v5::output_range<char_*,_char>_> *this,int value)

{
  iterator pcVar1;
  undefined1 *puVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  byte bVar6;
  uint uVar7;
  ptrdiff_t _Num;
  ulong __n;
  undefined1 local_25 [13];
  
  uVar4 = (ulong)(uint)-value;
  if (0 < value) {
    uVar4 = (ulong)(uint)value;
  }
  uVar3 = (uint)uVar4;
  uVar7 = 0x1f;
  if ((uVar3 | 1) != 0) {
    for (; (uVar3 | 1) >> uVar7 == 0; uVar7 = uVar7 - 1) {
    }
  }
  uVar7 = (uVar7 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  __n = (ulong)((uVar7 - (uVar3 < *(uint *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_32 +
                                           (ulong)uVar7 * 4))) + 1);
  if (value < 0) {
    pcVar1 = this->out_;
    this->out_ = pcVar1 + 1;
    *pcVar1 = '-';
  }
  puVar2 = local_25 + __n;
  if (99 < uVar3) {
    do {
      uVar7 = (uint)uVar4;
      uVar3 = (uint)(uVar4 / 100);
      uVar4 = uVar4 / 100;
      *(undefined2 *)(puVar2 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uVar7 + (int)uVar4 * -100) * 2);
      puVar2 = puVar2 + -2;
    } while (9999 < uVar7);
  }
  pcVar1 = this->out_;
  if (uVar3 < 10) {
    bVar6 = (byte)uVar3 | 0x30;
    lVar5 = -1;
  }
  else {
    puVar2[-1] = internal::basic_data<void>::DIGITS[((ulong)uVar3 * 2 & 0xffffffff) + 1];
    bVar6 = internal::basic_data<void>::DIGITS[(ulong)uVar3 * 2];
    lVar5 = -2;
  }
  puVar2[lVar5] = bVar6;
  if (__n != 0) {
    memcpy(pcVar1,local_25,__n);
  }
  this->out_ = pcVar1 + __n;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }